

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O3

ssize_t __thiscall
CompositedBupOutputter::write(CompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar2;
  undefined4 in_register_00000034;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  iVar1 = Image::writePNG((Image *)CONCAT44(in_register_00000034,__fd),(path *)__buf,&local_40);
  uVar2 = extraout_var;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    iVar1 = extraout_EAX;
    uVar2 = extraout_var_00;
  }
  return CONCAT44(uVar2,iVar1);
}

Assistant:

virtual void write(Image& img, fs::path path) {
		img.writePNG(path);
	}